

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableValue.cpp
# Opt level: O2

void rsg::ValueRange::computeIntersection
               (ValueRangeAccess dst,ConstValueRangeAccess *a,ConstValueRangeAccess *b)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  Type TVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  VariableType *pVVar10;
  ValueRangeAccess dst_00;
  ValueRangeAccess dst_01;
  ConstValueRangeAccess *this;
  int iVar11;
  int iVar12;
  ConstValueRangeAccess local_e0;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  ConstValueRangeAccess *local_a8;
  ConstValueRangeAccess *local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  ValueRangeAccess local_78;
  ValueRangeAccess local_60;
  ConstValueRangeAccess local_48;
  
  pVVar10 = a->m_type;
  TVar5 = pVVar10->m_baseType;
  if (TVar5 == TYPE_ARRAY) {
    iVar11 = pVVar10->m_numElements;
    iVar12 = 0;
    if (iVar11 < 1) {
      iVar11 = 0;
    }
    for (; iVar11 != iVar12; iVar12 = iVar12 + 1) {
      ValueRangeAccess::arrayElement(&local_78,&dst,iVar12);
      ConstValueRangeAccess::arrayElement(&local_e0,a,iVar12);
      ConstValueRangeAccess::arrayElement(&local_48,b,iVar12);
      dst_01.super_ConstValueRangeAccess.m_min = local_78.super_ConstValueRangeAccess.m_min;
      dst_01.super_ConstValueRangeAccess.m_type = local_78.super_ConstValueRangeAccess.m_type;
      dst_01.super_ConstValueRangeAccess.m_max = local_78.super_ConstValueRangeAccess.m_max;
      computeIntersection(dst_01,&local_e0,&local_48);
    }
  }
  else if (TVar5 == TYPE_STRUCT) {
    iVar11 = 0;
    iVar12 = (int)(((long)(pVVar10->m_members).
                          super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pVVar10->m_members).
                         super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x28);
    if (iVar12 < 1) {
      iVar12 = 0;
    }
    for (; iVar12 != iVar11; iVar11 = iVar11 + 1) {
      ValueRangeAccess::member(&local_60,&dst,iVar11);
      ConstValueRangeAccess::member(&local_e0,a,iVar11);
      ConstValueRangeAccess::member(&local_48,b,iVar11);
      dst_00.super_ConstValueRangeAccess.m_min = local_60.super_ConstValueRangeAccess.m_min;
      dst_00.super_ConstValueRangeAccess.m_type = local_60.super_ConstValueRangeAccess.m_type;
      dst_00.super_ConstValueRangeAccess.m_max = local_60.super_ConstValueRangeAccess.m_max;
      computeIntersection(dst_00,&local_e0,&local_48);
    }
  }
  else if (TVar5 - TYPE_FLOAT < 7) {
    iVar11 = pVVar10->m_numElements;
    switch(TVar5) {
    case TYPE_FLOAT:
      iVar12 = 0;
      if (iVar11 < 1) {
        iVar11 = 0;
      }
      for (; iVar11 != iVar12; iVar12 = iVar12 + 1) {
        ConstValueRangeAccess::component(&local_e0,a,iVar12);
        local_b8 = ZEXT416((uint)(local_e0.m_min)->intVal);
        ConstValueRangeAccess::component(&local_e0,a,iVar12);
        local_c8 = ZEXT416((uint)(local_e0.m_max)->intVal);
        ConstValueRangeAccess::component(&local_e0,b,iVar12);
        local_98 = ZEXT416((uint)(local_e0.m_min)->intVal);
        ConstValueRangeAccess::component(&local_e0,b,iVar12);
        local_88 = ZEXT416((uint)(local_e0.m_max)->intVal);
        local_b8._4_4_ = local_b8._4_4_ & local_98._4_4_;
        local_b8._0_4_ =
             ~-(uint)((float)local_98._0_4_ <= (float)local_b8._0_4_) & local_98._0_4_ |
             local_b8._0_4_ & -(uint)((float)local_98._0_4_ <= (float)local_b8._0_4_);
        local_b8._8_4_ = local_b8._8_4_ & local_98._8_4_;
        local_b8._12_4_ = local_b8._12_4_ & local_98._12_4_;
        ValueRangeAccess::component((ValueRangeAccess *)&local_e0,&dst,iVar12);
        (local_e0.m_min)->intVal = local_b8._0_4_;
        local_c8._4_4_ = ~local_c8._4_4_ & local_88._4_4_ | local_c8._4_4_;
        local_c8._0_4_ =
             ~-(uint)((float)local_c8._0_4_ <= (float)local_88._0_4_) & local_88._0_4_ |
             local_c8._0_4_ & -(uint)((float)local_c8._0_4_ <= (float)local_88._0_4_);
        local_c8._8_4_ = ~local_c8._8_4_ & local_88._8_4_ | local_c8._8_4_;
        local_c8._12_4_ = ~local_c8._12_4_ & local_88._12_4_ | local_c8._12_4_;
        ValueRangeAccess::component((ValueRangeAccess *)&local_e0,&dst,iVar12);
        (local_e0.m_max)->intVal = local_c8._0_4_;
      }
      break;
    default:
      iVar12 = 0;
      if (iVar11 < 1) {
        iVar11 = 0;
      }
      local_c8._0_4_ = iVar11;
      local_a8 = a;
      local_a0 = b;
      for (; this = local_a0, local_c8._0_4_ != iVar12; iVar12 = iVar12 + 1) {
        ConstValueRangeAccess::component(&local_e0,a,iVar12);
        uVar6 = (local_e0.m_min)->intVal;
        ConstValueRangeAccess::component(&local_e0,a,iVar12);
        uVar7 = (local_e0.m_max)->intVal;
        ConstValueRangeAccess::component(&local_e0,this,iVar12);
        uVar8 = (local_e0.m_min)->intVal;
        ConstValueRangeAccess::component(&local_e0,this,iVar12);
        uVar9 = (local_e0.m_max)->intVal;
        if ((int)uVar8 < (int)uVar6) {
          uVar8 = uVar6;
        }
        ValueRangeAccess::component((ValueRangeAccess *)&local_e0,&dst,iVar12);
        a = local_a8;
        (local_e0.m_min)->intVal = uVar8;
        if ((int)uVar7 < (int)uVar9) {
          uVar9 = uVar7;
        }
        ValueRangeAccess::component((ValueRangeAccess *)&local_e0,&dst,iVar12);
        (local_e0.m_max)->intVal = uVar9;
      }
      break;
    case TYPE_BOOL:
      iVar12 = 0;
      if (iVar11 < 1) {
        iVar11 = 0;
      }
      local_c8._0_4_ = iVar11;
      for (; local_c8._0_4_ != iVar12; iVar12 = iVar12 + 1) {
        ConstValueRangeAccess::component(&local_e0,a,iVar12);
        bVar1 = (local_e0.m_min)->boolVal;
        ConstValueRangeAccess::component(&local_e0,a,iVar12);
        bVar2 = (local_e0.m_max)->boolVal;
        ConstValueRangeAccess::component(&local_e0,b,iVar12);
        bVar3 = (local_e0.m_min)->boolVal;
        ConstValueRangeAccess::component(&local_e0,b,iVar12);
        bVar4 = (local_e0.m_max)->boolVal;
        ValueRangeAccess::component((ValueRangeAccess *)&local_e0,&dst,iVar12);
        (local_e0.m_min)->boolVal = (bool)(bVar1 | bVar3);
        ValueRangeAccess::component((ValueRangeAccess *)&local_e0,&dst,iVar12);
        (local_e0.m_max)->boolVal = (bool)(bVar2 & bVar4);
      }
      break;
    case TYPE_STRUCT:
    case TYPE_ARRAY:
      break;
    }
  }
  return;
}

Assistant:

void ValueRange::computeIntersection (ValueRangeAccess dst, const ConstValueRangeAccess& a, const ConstValueRangeAccess& b)
{
	DE_ASSERT(dst.getType() == a.getType() && dst.getType() == b.getType());

	if (a.getType().isStruct())
	{
		int numMembers = (int)a.getType().getMembers().size();
		for (int ndx = 0; ndx < numMembers; ndx++)
			computeIntersection(dst.member(ndx), a.member(ndx), b.member(ndx));
	}
	else if (a.getType().isArray())
	{
		int numElements = (int)a.getType().getNumElements();
		for (int ndx = 0; ndx < numElements; ndx++)
			computeIntersection(dst.arrayElement(ndx), a.arrayElement(ndx), b.arrayElement(ndx));
	}
	else
	{
		int numElements = (int)a.getType().getNumElements();
		switch (a.getType().getBaseType())
		{
			case VariableType::TYPE_FLOAT:
				for (int ndx = 0; ndx < numElements; ndx++)
				{
					float aMin = a.component(ndx).getMin().asFloat();
					float aMax = a.component(ndx).getMax().asFloat();
					float bMin = b.component(ndx).getMin().asFloat();
					float bMax = b.component(ndx).getMax().asFloat();

					dst.component(ndx).getMin() = de::max(aMin, bMin);
					dst.component(ndx).getMax() = de::min(aMax, bMax);
				}
				break;

			case VariableType::TYPE_INT:
			case VariableType::TYPE_SAMPLER_2D:
			case VariableType::TYPE_SAMPLER_CUBE:
				for (int ndx = 0; ndx < numElements; ndx++)
				{
					int aMin = a.component(ndx).getMin().asInt();
					int aMax = a.component(ndx).getMax().asInt();
					int bMin = b.component(ndx).getMin().asInt();
					int bMax = b.component(ndx).getMax().asInt();

					dst.component(ndx).getMin() = de::max(aMin, bMin);
					dst.component(ndx).getMax() = de::min(aMax, bMax);
				}
				break;

			case VariableType::TYPE_BOOL:
				for (int ndx = 0; ndx < numElements; ndx++)
				{
					bool aMin = a.component(ndx).getMin().asBool();
					bool aMax = a.component(ndx).getMax().asBool();
					bool bMin = b.component(ndx).getMin().asBool();
					bool bMax = b.component(ndx).getMax().asBool();

					dst.component(ndx).getMin() = aMin || bMin;
					dst.component(ndx).getMax() = aMax && bMax;
				}
				break;

			default:
				DE_ASSERT(DE_FALSE);
		}
	}
}